

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::Generate
          (MessageGenerator *this,Printer *printer)

{
  csharp *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  Printer *pPVar1;
  bool bVar2;
  mapped_type *pmVar3;
  FieldGeneratorBase *pFVar4;
  Options *pOVar5;
  Descriptor *pDVar6;
  long *plVar7;
  char *pcVar8;
  AlphaNum *a;
  FileDescriptor *descriptor;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  FieldDescriptor *pFVar9;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *descriptor_00;
  AlphaNum *a_03;
  FieldDescriptor *extraout_RDX_00;
  int i;
  int i32;
  long lVar10;
  long lVar11;
  long lVar12;
  allocator local_179;
  Printer *local_178;
  key_type local_170;
  FieldDescriptor *local_150;
  long local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  EnumGenerator enumGenerator;
  key_type local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  class_name_abi_cxx11_((string *)&enumGenerator,this);
  std::__cxx11::string::string((string *)&local_170,"class_name",(allocator *)&local_140);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_170);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&enumGenerator);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&enumGenerator);
  SourceGeneratorBase::class_access_level_abi_cxx11_
            ((string *)&enumGenerator,&this->super_SourceGeneratorBase);
  std::__cxx11::string::string((string *)&local_170,"access_level",(allocator *)&local_140);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_170);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&enumGenerator);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&enumGenerator);
  WriteMessageDocComment(printer,this->descriptor_);
  AddDeprecatedFlag(this,printer);
  AddSerializableAttribute(this,printer);
  io::Printer::Print(printer,&vars,"$access_level$ sealed partial class $class_name$ : ");
  pcVar8 = "pb::IMessage<$class_name$>\n";
  if (this->has_extension_ranges_ != false) {
    pcVar8 = "pb::IExtendableMessage<$class_name$>\n";
  }
  io::Printer::Print(printer,&vars,pcVar8);
  io::Printer::Print<>(printer,"#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  io::Printer::Print<>(printer,"    , pb::IBufferMessage\n");
  io::Printer::Print<>(printer,"#endif\n");
  io::Printer::Print<>(printer,"{\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,&vars,
                     "private static readonly pb::MessageParser<$class_name$> _parser = new pb::MessageParser<$class_name$>(() => new $class_name$());\n"
                    );
  io::Printer::Print<>(printer,"private pb::UnknownFieldSet _unknownFields;\n");
  if (this->has_extension_ranges_ == true) {
    bVar2 = IsDescriptorProto(*(FileDescriptor **)(this->descriptor_ + 0x10));
    pcVar8 = "private pb::ExtensionSet<$class_name$> _extensions;\n";
    if (bVar2) {
      pcVar8 = "internal pb::ExtensionSet<$class_name$> _extensions;\n";
    }
    io::Printer::Print(printer,&vars,pcVar8);
    io::Printer::Print(printer,&vars,
                       "private pb::ExtensionSet<$class_name$> _Extensions { get { return _extensions; } }\n"
                      );
  }
  for (i32 = 0; i32 < this->has_bit_field_count_; i32 = i32 + 1) {
    strings::AlphaNum::AlphaNum((AlphaNum *)&enumGenerator,i32);
    StrCat_abi_cxx11_(&local_170,(protobuf *)&enumGenerator,a);
    io::Printer::Print<char[2],std::__cxx11::string>
              (printer,"private int _hasBits$i$;\n",(char (*) [2])"i",&local_170);
    std::__cxx11::string::~string((string *)&local_170);
  }
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public static pb::MessageParser<$class_name$> Parser { get { return _parser; } }\n\n"
                    );
  this_00 = *(csharp **)(this->descriptor_ + 0x18);
  if (this_00 == (csharp *)0x0) {
    GetReflectionClassName_abi_cxx11_(&local_70,*(csharp **)(this->descriptor_ + 0x10),descriptor);
    std::operator+(&local_50,&local_70,".Descriptor.MessageTypes[");
    pDVar6 = this->descriptor_;
    plVar7 = (long *)(*(long *)(pDVar6 + 0x10) + 0x58);
    if (*(long *)(pDVar6 + 0x18) != 0) {
      plVar7 = (long *)(*(long *)(pDVar6 + 0x18) + 0x38);
    }
    strings::AlphaNum::AlphaNum((AlphaNum *)&enumGenerator,(int)(((long)pDVar6 - *plVar7) / 0x88));
    StrCat_abi_cxx11_(&local_90,(protobuf *)&enumGenerator,a_01);
    std::operator+(&local_140,&local_50,&local_90);
    std::operator+(&local_170,&local_140,"]");
    std::__cxx11::string::string((string *)&local_b0,"descriptor_accessor",&local_179);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_b0);
  }
  else {
    GetClassName_abi_cxx11_(&local_70,this_00,(Descriptor *)descriptor);
    std::operator+(&local_50,&local_70,".Descriptor.NestedTypes[");
    pDVar6 = this->descriptor_;
    plVar7 = (long *)(*(long *)(pDVar6 + 0x10) + 0x58);
    if (*(long *)(pDVar6 + 0x18) != 0) {
      plVar7 = (long *)(*(long *)(pDVar6 + 0x18) + 0x38);
    }
    strings::AlphaNum::AlphaNum((AlphaNum *)&enumGenerator,(int)(((long)pDVar6 - *plVar7) / 0x88));
    StrCat_abi_cxx11_(&local_90,(protobuf *)&enumGenerator,a_00);
    std::operator+(&local_140,&local_50,&local_90);
    std::operator+(&local_170,&local_140,"]");
    std::__cxx11::string::string((string *)&local_b0,"descriptor_accessor",&local_179);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_b0);
  }
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public static pbr::MessageDescriptor Descriptor {\n  get { return $descriptor_accessor$; }\n}\n\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "pbr::MessageDescriptor pb::IMessage.Descriptor {\n  get { return Descriptor; }\n}\n\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public $class_name$() {\n  OnConstruction();\n}\n\npartial void OnConstruction();\n\n"
                    );
  GenerateCloningCode(this,printer);
  pFVar9 = (FieldDescriptor *)0x0;
  lVar11 = 0;
  local_178 = printer;
  while (pDVar6 = this->descriptor_, lVar11 < *(int *)(pDVar6 + 4)) {
    lVar10 = *(long *)(pDVar6 + 0x28);
    args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (pFVar9 + lVar10 + 8);
    local_148 = lVar11;
    GetFieldConstantName_abi_cxx11_(&local_170,(csharp *)(pFVar9 + lVar10),pFVar9);
    local_150 = pFVar9;
    strings::AlphaNum::AlphaNum((AlphaNum *)&enumGenerator,*(int *)(pFVar9 + lVar10 + 4));
    StrCat_abi_cxx11_(&local_140,(protobuf *)&enumGenerator,a_02);
    io::Printer::
    Print<char[11],std::__cxx11::string,char[20],std::__cxx11::string,char[6],std::__cxx11::string>
              (local_178,
               "/// <summary>Field number for the \"$field_name$\" field.</summary>\npublic const int $field_constant_name$ = $index$;\n"
               ,(char (*) [11])0x3f313c,args_1,(char (*) [20])"field_constant_name",&local_170,
               (char (*) [6])0x3e57aa,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_170);
    pFVar4 = CreateFieldGeneratorInternal(this,pFVar9 + lVar10);
    pPVar1 = local_178;
    (*(pFVar4->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[6])(pFVar4,local_178);
    io::Printer::Print<>(pPVar1,"\n");
    (*(pFVar4->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar4);
    pFVar9 = local_150 + 0x48;
    lVar11 = local_148 + 1;
  }
  for (pFVar9 = (FieldDescriptor *)0x0; pPVar1 = local_178,
      (long)pFVar9 < (long)*(int *)(pDVar6 + 0x6c); pFVar9 = pFVar9 + 1) {
    lVar11 = *(long *)(pDVar6 + 0x30);
    UnderscoresToCamelCase
              ((string *)&enumGenerator,*(string **)(lVar11 + 8 + (long)pFVar9 * 0x28),false);
    std::__cxx11::string::string((string *)&local_170,"name",(allocator *)&local_140);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_170);
    lVar11 = lVar11 + (long)pFVar9 * 0x28;
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&enumGenerator);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&enumGenerator);
    UnderscoresToCamelCase((string *)&enumGenerator,*(string **)(lVar11 + 8),true);
    std::__cxx11::string::string((string *)&local_170,"property_name",(allocator *)&local_140);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_170);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&enumGenerator);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&enumGenerator);
    std::__cxx11::string::string((string *)&enumGenerator,"original_name",(allocator *)&local_170);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&enumGenerator);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::__cxx11::string::~string((string *)&enumGenerator);
    pPVar1 = local_178;
    io::Printer::Print(local_178,&vars,
                       "private object $name$_;\n/// <summary>Enum of possible cases for the \"$original_name$\" oneof.</summary>\npublic enum $property_name$OneofCase {\n"
                      );
    io::Printer::Indent(pPVar1);
    io::Printer::Print<>(pPVar1,"None = 0,\n");
    lVar12 = 0;
    descriptor_00 = extraout_RDX;
    local_150 = pFVar9;
    local_148 = lVar11;
    for (lVar10 = 0; pFVar9 = local_150, pPVar1 = local_178, lVar10 < *(int *)(local_148 + 4);
        lVar10 = lVar10 + 1) {
      lVar11 = *(long *)(local_148 + 0x20);
      GetPropertyName_abi_cxx11_(&local_170,(csharp *)(lVar11 + lVar12),descriptor_00);
      strings::AlphaNum::AlphaNum((AlphaNum *)&enumGenerator,*(int *)(lVar11 + 4 + lVar12));
      StrCat_abi_cxx11_(&local_140,(protobuf *)&enumGenerator,a_03);
      io::Printer::Print<char[20],std::__cxx11::string,char[6],std::__cxx11::string>
                (local_178,"$field_property_name$ = $index$,\n",(char (*) [20])"field_property_name"
                 ,&local_170,(char (*) [6])0x3e57aa,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_170);
      lVar12 = lVar12 + 0x48;
      descriptor_00 = extraout_RDX_00;
    }
    io::Printer::Outdent(local_178);
    io::Printer::Print<>(pPVar1,"}\n");
    io::Printer::Print(pPVar1,&vars,
                       "private $property_name$OneofCase $name$Case_ = $property_name$OneofCase.None;\n"
                      );
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,pPVar1);
    io::Printer::Print(pPVar1,&vars,
                       "public $property_name$OneofCase $property_name$Case {\n  get { return $name$Case_; }\n}\n\n"
                      );
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,pPVar1);
    io::Printer::Print(pPVar1,&vars,
                       "public void Clear$property_name$() {\n  $name$Case_ = $property_name$OneofCase.None;\n  $name$_ = null;\n}\n\n"
                      );
    pDVar6 = this->descriptor_;
  }
  GenerateFrameworkMethods(this,local_178);
  GenerateMessageSerializationMethods(this,pPVar1);
  GenerateMergingMethods(this,pPVar1);
  if (this->has_extension_ranges_ == true) {
    io::Printer::Print(pPVar1,&vars,
                       "public TValue GetExtension<TValue>(pb::Extension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.Get(ref _extensions, extension);\n}\npublic pbc::RepeatedField<TValue> GetExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.Get(ref _extensions, extension);\n}\npublic pbc::RepeatedField<TValue> GetOrInitializeExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.GetOrInitialize(ref _extensions, extension);\n}\npublic void SetExtension<TValue>(pb::Extension<$class_name$, TValue> extension, TValue value) {\n  pb::ExtensionSet.Set(ref _extensions, extension, value);\n}\npublic bool HasExtension<TValue>(pb::Extension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.Has(ref _extensions, extension);\n}\npublic void ClearExtension<TValue>(pb::Extension<$class_name$, TValue> extension) {\n  pb::ExtensionSet.Clear(ref _extensions, extension);\n}\npublic void ClearExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> extension) {\n  pb::ExtensionSet.Clear(ref _extensions, extension);\n}\n\n"
                      );
  }
  bVar2 = HasNestedGeneratedTypes(this);
  if (bVar2) {
    io::Printer::Print(pPVar1,&vars,
                       "#region Nested types\n/// <summary>Container for nested types declared in the $class_name$ message type.</summary>\n"
                      );
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,pPVar1);
    io::Printer::Print<>(pPVar1,"public static partial class Types {\n");
    io::Printer::Indent(pPVar1);
    lVar10 = 0;
    for (lVar11 = 0; pDVar6 = this->descriptor_, lVar11 < *(int *)(pDVar6 + 0x74);
        lVar11 = lVar11 + 1) {
      lVar12 = *(long *)(pDVar6 + 0x40);
      pOVar5 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
      EnumGenerator::EnumGenerator(&enumGenerator,(EnumDescriptor *)(lVar12 + lVar10),pOVar5);
      EnumGenerator::Generate(&enumGenerator,pPVar1);
      EnumGenerator::~EnumGenerator(&enumGenerator);
      lVar10 = lVar10 + 0x48;
    }
    lVar10 = 0;
    for (lVar11 = 0; lVar11 < *(int *)(pDVar6 + 0x70); lVar11 = lVar11 + 1) {
      lVar12 = *(long *)(pDVar6 + 0x38);
      if (*(char *)(*(long *)(lVar12 + 0x20 + lVar10) + 0x4b) == '\0') {
        pOVar5 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
        MessageGenerator((MessageGenerator *)&enumGenerator,(Descriptor *)(lVar12 + lVar10),pOVar5);
        Generate((MessageGenerator *)&enumGenerator,pPVar1);
        ~MessageGenerator((MessageGenerator *)&enumGenerator);
        pDVar6 = this->descriptor_;
      }
      lVar10 = lVar10 + 0x88;
    }
    io::Printer::Outdent(pPVar1);
    io::Printer::Print<>(pPVar1,"}\n#endregion\n\n");
  }
  if (0 < *(int *)(this->descriptor_ + 0x7c)) {
    io::Printer::Print(pPVar1,&vars,
                       "#region Extensions\n/// <summary>Container for extensions for other messages declared in the $class_name$ message type.</summary>\n"
                      );
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,pPVar1);
    io::Printer::Print<>(pPVar1,"public static partial class Extensions {\n");
    io::Printer::Indent(pPVar1);
    lVar11 = 0;
    for (lVar10 = 0; lVar10 < *(int *)(this->descriptor_ + 0x7c); lVar10 = lVar10 + 1) {
      pFVar4 = CreateFieldGeneratorInternal
                         (this,(FieldDescriptor *)(*(long *)(this->descriptor_ + 0x50) + lVar11));
      (*(pFVar4->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[5])(pFVar4,pPVar1);
      (*(pFVar4->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar4);
      lVar11 = lVar11 + 0x48;
    }
    io::Printer::Outdent(pPVar1);
    io::Printer::Print<>(pPVar1,"}\n#endregion\n\n");
  }
  io::Printer::Outdent(pPVar1);
  io::Printer::Print<>(pPVar1,"}\n");
  io::Printer::Print<>(pPVar1,"\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageGenerator::Generate(io::Printer* printer) {
  std::map<std::string, std::string> vars;
  vars["class_name"] = class_name();
  vars["access_level"] = class_access_level();

  WriteMessageDocComment(printer, descriptor_);
  AddDeprecatedFlag(printer);
  AddSerializableAttribute(printer);

  printer->Print(
    vars,
    "$access_level$ sealed partial class $class_name$ : ");

  if (has_extension_ranges_) {
    printer->Print(vars, "pb::IExtendableMessage<$class_name$>\n");
  }
  else {
    printer->Print(vars, "pb::IMessage<$class_name$>\n");
  }
  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  printer->Print("    , pb::IBufferMessage\n");
  printer->Print("#endif\n");
  printer->Print("{\n");
  printer->Indent();

  // All static fields and properties
  printer->Print(
      vars,
      "private static readonly pb::MessageParser<$class_name$> _parser = new pb::MessageParser<$class_name$>(() => new $class_name$());\n");

  printer->Print(
      "private pb::UnknownFieldSet _unknownFields;\n");

  if (has_extension_ranges_) {
    if (IsDescriptorProto(descriptor_->file())) {
      printer->Print(vars, "internal pb::ExtensionSet<$class_name$> _extensions;\n"); // CustomOptions compatibility
    } else {
      printer->Print(vars, "private pb::ExtensionSet<$class_name$> _extensions;\n");
    }

    // a read-only property for fast
    // retrieval of the set in IsInitialized
    printer->Print(vars,
                   "private pb::ExtensionSet<$class_name$> _Extensions { get { "
                   "return _extensions; } }\n");
  }

  for (int i = 0; i < has_bit_field_count_; i++) {
    // don't use arrays since all arrays are heap allocated, saving allocations
    // use ints instead of bytes since bytes lack bitwise operators, saving casts
    printer->Print("private int _hasBits$i$;\n", "i", StrCat(i));
  }

  WriteGeneratedCodeAttributes(printer);

  printer->Print(
      vars,
      "public static pb::MessageParser<$class_name$> Parser { get { return _parser; } }\n\n");

  // Access the message descriptor via the relevant file descriptor or containing message descriptor.
  if (!descriptor_->containing_type()) {
    vars["descriptor_accessor"] = GetReflectionClassName(descriptor_->file())
        + ".Descriptor.MessageTypes[" + StrCat(descriptor_->index()) + "]";
  } else {
    vars["descriptor_accessor"] = GetClassName(descriptor_->containing_type())
        + ".Descriptor.NestedTypes[" + StrCat(descriptor_->index()) + "]";
  }

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public static pbr::MessageDescriptor Descriptor {\n"
    "  get { return $descriptor_accessor$; }\n"
    "}\n"
    "\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "pbr::MessageDescriptor pb::IMessage.Descriptor {\n"
    "  get { return Descriptor; }\n"
    "}\n"
    "\n");

  // Parameterless constructor and partial OnConstruction method.
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public $class_name$() {\n"
    "  OnConstruction();\n"
    "}\n\n"
    "partial void OnConstruction();\n\n");

  GenerateCloningCode(printer);
  GenerateFreezingCode(printer);

  // Fields/properties
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* fieldDescriptor = descriptor_->field(i);

    // Rats: we lose the debug comment here :(
    printer->Print(
      "/// <summary>Field number for the \"$field_name$\" field.</summary>\n"
      "public const int $field_constant_name$ = $index$;\n",
      "field_name", fieldDescriptor->name(),
      "field_constant_name", GetFieldConstantName(fieldDescriptor),
      "index", StrCat(fieldDescriptor->number()));
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(fieldDescriptor));
    generator->GenerateMembers(printer);
    printer->Print("\n");
  }

  // oneof properties (for real oneofs, which come before synthetic ones)
  for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    vars["name"] = UnderscoresToCamelCase(oneof->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(oneof->name(), true);
    vars["original_name"] = oneof->name();
    printer->Print(
      vars,
      "private object $name$_;\n"
      "/// <summary>Enum of possible cases for the \"$original_name$\" oneof.</summary>\n"
      "public enum $property_name$OneofCase {\n");
    printer->Indent();
    printer->Print("None = 0,\n");
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print("$field_property_name$ = $index$,\n",
                     "field_property_name", GetPropertyName(field),
                     "index", StrCat(field->number()));
    }
    printer->Outdent();
    printer->Print("}\n");
    // TODO: Should we put the oneof .proto comments here?
    // It's unclear exactly where they should go.
    printer->Print(
      vars,
      "private $property_name$OneofCase $name$Case_ = $property_name$OneofCase.None;\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print(
      vars,
      "public $property_name$OneofCase $property_name$Case {\n"
      "  get { return $name$Case_; }\n"
      "}\n\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print(
      vars,
      "public void Clear$property_name$() {\n"
      "  $name$Case_ = $property_name$OneofCase.None;\n"
      "  $name$_ = null;\n"
      "}\n\n");
  }

  // Standard methods
  GenerateFrameworkMethods(printer);
  GenerateMessageSerializationMethods(printer);
  GenerateMergingMethods(printer);

  if (has_extension_ranges_) {
    printer->Print(
        vars,
        "public TValue GetExtension<TValue>(pb::Extension<$class_name$, "
        "TValue> extension) {\n"
        "  return pb::ExtensionSet.Get(ref _extensions, extension);\n"
        "}\n"
        "public pbc::RepeatedField<TValue> "
        "GetExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> "
        "extension) {\n"
        "  return pb::ExtensionSet.Get(ref _extensions, extension);\n"
        "}\n"
        "public pbc::RepeatedField<TValue> "
        "GetOrInitializeExtension<TValue>(pb::RepeatedExtension<$class_name$, "
        "TValue> extension) {\n"
        "  return pb::ExtensionSet.GetOrInitialize(ref _extensions, "
        "extension);\n"
        "}\n"
        "public void SetExtension<TValue>(pb::Extension<$class_name$, TValue> "
        "extension, TValue value) {\n"
        "  pb::ExtensionSet.Set(ref _extensions, extension, value);\n"
        "}\n"
        "public bool HasExtension<TValue>(pb::Extension<$class_name$, TValue> "
        "extension) {\n"
        "  return pb::ExtensionSet.Has(ref _extensions, extension);\n"
        "}\n"
        "public void ClearExtension<TValue>(pb::Extension<$class_name$, "
        "TValue> extension) {\n"
        "  pb::ExtensionSet.Clear(ref _extensions, extension);\n"
        "}\n"
        "public void "
        "ClearExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> "
        "extension) {\n"
        "  pb::ExtensionSet.Clear(ref _extensions, extension);\n"
        "}\n\n");
  }

  // Nested messages and enums
  if (HasNestedGeneratedTypes()) {
    printer->Print(
      vars,
      "#region Nested types\n"
      "/// <summary>Container for nested types declared in the $class_name$ message type.</summary>\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print("public static partial class Types {\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->enum_type_count(); i++) {
      EnumGenerator enumGenerator(descriptor_->enum_type(i), this->options());
      enumGenerator.Generate(printer);
    }
    for (int i = 0; i < descriptor_->nested_type_count(); i++) {
      // Don't generate nested types for maps...
      if (!IsMapEntryMessage(descriptor_->nested_type(i))) {
        MessageGenerator messageGenerator(
            descriptor_->nested_type(i), this->options());
        messageGenerator.Generate(printer);
      }
    }
    printer->Outdent();
    printer->Print("}\n"
                   "#endregion\n"
                   "\n");
  }

  if (descriptor_->extension_count() > 0) {
    printer->Print(
      vars,
      "#region Extensions\n"
      "/// <summary>Container for extensions for other messages declared in the $class_name$ message type.</summary>\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print("public static partial class Extensions {\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->extension_count(); i++) {
      std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(descriptor_->extension(i)));
      generator->GenerateExtensionCode(printer);
    }
    printer->Outdent();
    printer->Print(
      "}\n"
      "#endregion\n"
      "\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("\n");
}